

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ons_ons_cluster_list.cc
# Opt level: O2

int __thiscall
aliyun::Ons::OnsClusterList
          (Ons *this,OnsOnsClusterListRequestType *req,OnsOnsClusterListResponseType *response,
          OnsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *pVVar6;
  char *pcVar7;
  uint index;
  uint index_00;
  allocator<char> local_4f0;
  allocator<char> local_4ef;
  allocator<char> local_4ee;
  allocator<char> local_4ed;
  uint local_4ec;
  Value val;
  undefined1 local_4c8 [32];
  _Alloc_hider local_4a8;
  size_type local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  Int local_488;
  _Alloc_hider local_480;
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_460;
  size_type local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Alloc_hider local_440;
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  float local_420;
  float local_41c;
  float local_418;
  float local_414;
  float local_410;
  float local_40c;
  undefined1 local_408 [24];
  _Alloc_hider local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  Value *local_3c8;
  string str_response;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&local_160);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar7,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"OnsClusterList",(allocator<char> *)local_408);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->ons_region_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"OnsRegionId",(allocator<char> *)local_4c8);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->ons_platform)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"OnsPlatform",(allocator<char> *)local_4c8);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->ons_platform);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->prevent_cache)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"PreventCache",(allocator<char> *)local_4c8);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->prevent_cache);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->cluster)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"Cluster",(allocator<char> *)local_4c8);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->cluster);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"RegionId",(allocator<char> *)local_4c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,this->region_id_,(allocator<char> *)local_408);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (OnsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_4c8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c8,anon_var_dwarf_1ba8e0 + 9,&local_4ed);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_4c8);
        std::__cxx11::string::~string((string *)local_4c8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_4c8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c8,anon_var_dwarf_1ba8e0 + 9,&local_4ee);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_4c8);
        std::__cxx11::string::~string((string *)local_4c8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_4c8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c8,anon_var_dwarf_1ba8e0 + 9,&local_4ef);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_4c8);
        std::__cxx11::string::~string((string *)local_4c8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_4c8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c8,anon_var_dwarf_1ba8e0 + 9,&local_4f0);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_4c8);
        std::__cxx11::string::~string((string *)local_4c8);
      }
      if (response != (OnsOnsClusterListResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"HelpUrl");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HelpUrl");
          Json::Value::asString_abi_cxx11_((string *)local_4c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->help_url,(string *)local_4c8);
          std::__cxx11::string::~string((string *)local_4c8);
        }
        bVar1 = Json::Value::isMember(&val,"Data");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Data");
          bVar1 = Json::Value::isMember(pVVar4,"ClusterInfoDataDo");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Data");
            pVVar4 = Json::Value::operator[](pVVar4,"ClusterInfoDataDo");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              local_3c8 = pVVar4;
              for (index = 0; pVVar4 = local_3c8, AVar3 = Json::Value::size(local_3c8),
                  index < AVar3; index = index + 1) {
                local_408._0_8_ = (pointer)0x0;
                local_408._8_8_ = (pointer)0x0;
                local_408._16_8_ = (pointer)0x0;
                local_3f0._M_p = (pointer)&local_3e0;
                local_3e8 = 0;
                local_3e0._M_local_buf[0] = '\0';
                pVVar4 = Json::Value::operator[](pVVar4,index);
                bVar1 = Json::Value::isMember(pVVar4,"ClusterName");
                local_4ec = index;
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"ClusterName");
                  Json::Value::asString_abi_cxx11_((string *)local_4c8,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_3f0,(string *)local_4c8);
                  index = local_4ec;
                  std::__cxx11::string::~string((string *)local_4c8);
                }
                bVar1 = Json::Value::isMember(pVVar4,"BrokerInfoList");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"BrokerInfoList");
                  bVar1 = Json::Value::isMember(pVVar5,"BrokerInfoDataDo");
                  if (bVar1) {
                    pVVar4 = Json::Value::operator[](pVVar4,"BrokerInfoList");
                    pVVar4 = Json::Value::operator[](pVVar4,"BrokerInfoDataDo");
                    bVar1 = Json::Value::isArray(pVVar4);
                    if (bVar1) {
                      for (index_00 = 0; AVar3 = Json::Value::size(pVVar4), index_00 < AVar3;
                          index_00 = index_00 + 1) {
                        local_4c8._0_8_ = local_4c8 + 0x10;
                        local_4c8._8_8_ = 0;
                        local_4c8[0x10] = '\0';
                        local_4a8._M_p = (pointer)&local_498;
                        local_4a0 = 0;
                        local_498._M_local_buf[0] = '\0';
                        local_480._M_p = (pointer)&local_470;
                        local_478 = 0;
                        local_470._M_local_buf[0] = '\0';
                        local_460._M_p = (pointer)&local_450;
                        local_458 = 0;
                        local_450._M_local_buf[0] = '\0';
                        local_440._M_p = (pointer)&local_430;
                        local_438 = 0;
                        local_430._M_local_buf[0] = '\0';
                        pVVar5 = Json::Value::operator[](pVVar4,index_00);
                        bVar1 = Json::Value::isMember(pVVar5,"ClusterName");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"ClusterName");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                          std::__cxx11::string::operator=((string *)local_4c8,(string *)&local_160);
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"BrokerName");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"BrokerName");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                          std::__cxx11::string::operator=((string *)&local_4a8,(string *)&local_160)
                          ;
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"BrokerId");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"BrokerId");
                          local_488 = Json::Value::asInt(pVVar6);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"BrokerAddr");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"BrokerAddr");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                          std::__cxx11::string::operator=((string *)&local_480,(string *)&local_160)
                          ;
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"BrokerIp");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"BrokerIp");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                          std::__cxx11::string::operator=((string *)&local_460,(string *)&local_160)
                          ;
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"Version");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"Version");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                          std::__cxx11::string::operator=((string *)&local_440,(string *)&local_160)
                          ;
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"InTPS");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"InTPS");
                          local_420 = Json::Value::asFloat(pVVar6);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"OutTPS");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"OutTPS");
                          local_41c = Json::Value::asFloat(pVVar6);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"InTotalYest");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"InTotalYest");
                          local_418 = Json::Value::asFloat(pVVar6);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"OutTotalYest");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"OutTotalYest");
                          local_414 = Json::Value::asFloat(pVVar6);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"InTotalToday");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"InTotalToday");
                          local_410 = Json::Value::asFloat(pVVar6);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"OutTotalToday");
                        if (bVar1) {
                          pVVar5 = Json::Value::operator[](pVVar5,"OutTotalToday");
                          local_40c = Json::Value::asFloat(pVVar5);
                        }
                        std::
                        vector<aliyun::OnsOnsClusterListBrokerInfoDataDoType,_std::allocator<aliyun::OnsOnsClusterListBrokerInfoDataDoType>_>
                        ::push_back((vector<aliyun::OnsOnsClusterListBrokerInfoDataDoType,_std::allocator<aliyun::OnsOnsClusterListBrokerInfoDataDoType>_>
                                     *)local_408,(value_type *)local_4c8);
                        OnsOnsClusterListBrokerInfoDataDoType::
                        ~OnsOnsClusterListBrokerInfoDataDoType
                                  ((OnsOnsClusterListBrokerInfoDataDoType *)local_4c8);
                        index = local_4ec;
                      }
                    }
                  }
                }
                std::
                vector<aliyun::OnsOnsClusterListClusterInfoDataDoType,_std::allocator<aliyun::OnsOnsClusterListClusterInfoDataDoType>_>
                ::push_back(&response->data,(value_type *)local_408);
                OnsOnsClusterListClusterInfoDataDoType::~OnsOnsClusterListClusterInfoDataDoType
                          ((OnsOnsClusterListClusterInfoDataDoType *)local_408);
              }
              iVar2 = 200;
            }
          }
        }
      }
      goto LAB_00140033;
    }
  }
  iVar2 = -1;
  if (error_info != (OnsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00140033:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ons::OnsClusterList(const OnsOnsClusterListRequestType& req,
                      OnsOnsClusterListResponseType* response,
                       OnsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","OnsClusterList");
  if(!req.ons_region_id.empty()) {
    req_rpc->AddRequestQuery("OnsRegionId", req.ons_region_id);
  }
  if(!req.ons_platform.empty()) {
    req_rpc->AddRequestQuery("OnsPlatform", req.ons_platform);
  }
  if(!req.prevent_cache.empty()) {
    req_rpc->AddRequestQuery("PreventCache", req.prevent_cache);
  }
  if(!req.cluster.empty()) {
    req_rpc->AddRequestQuery("Cluster", req.cluster);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}